

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.cpp
# Opt level: O1

u32string * LiteScript::String::ConvertToUnicode(u32string *__return_storage_ptr__,string *str)

{
  byte bVar1;
  uint uVar2;
  pointer pcVar3;
  pointer pcVar4;
  bool bVar5;
  bool bVar6;
  uint uVar7;
  uint uVar8;
  char32_t __c;
  ulong uVar9;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = L'\0';
  uVar2 = (uint)str->_M_string_length;
  if (uVar2 != 0) {
    bVar6 = false;
    uVar9 = 0;
    do {
      uVar8 = (uint)uVar9;
      pcVar3 = (str->_M_dataplus)._M_p;
      bVar1 = pcVar3[uVar9];
      __c = (char32_t)bVar1;
      if ((char)bVar1 < '\0') {
        if ((bVar1 >> 4 & 2) == 0) {
          if (uVar2 - 1 <= uVar8) goto LAB_0013cd5a;
          std::__cxx11::
          basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::push_back
                    (__return_storage_ptr__,(byte)pcVar3[uVar9 + 1] & 0x3f | (__c & 0x1fU) << 6);
          uVar8 = uVar8 + 1;
          bVar5 = true;
        }
        else if ((bVar1 >> 4 & 1) == 0) {
          if (uVar8 < uVar2 - 2) {
            uVar8 = uVar8 + 2;
            bVar5 = true;
            std::__cxx11::
            basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::push_back
                      (__return_storage_ptr__,
                       (byte)pcVar3[uVar8] & 0x3f |
                       ((byte)pcVar3[uVar9 + 1] & 0x3f) << 6 | (__c & 0xfU) << 0xc);
          }
          else {
LAB_0013cd5a:
            bVar6 = true;
            bVar5 = false;
          }
        }
        else {
          if (uVar2 - 3 <= uVar8) goto LAB_0013cd5a;
          uVar7 = uVar8 + 2;
          uVar8 = uVar8 + 3;
          bVar5 = true;
          std::__cxx11::
          basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::push_back
                    (__return_storage_ptr__,
                     (byte)pcVar3[uVar8] & 0x3f |
                     ((byte)pcVar3[uVar7] & 0x3f) << 6 |
                     ((byte)pcVar3[uVar9 + 1] & 0x3f) << 0xc | (__c & 7U) << 0x12);
        }
      }
      else {
        bVar5 = true;
        std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
        ::push_back(__return_storage_ptr__,__c);
      }
      if (!bVar5) {
        if (bVar6) {
          return __return_storage_ptr__;
        }
        pcVar4 = (__return_storage_ptr__->_M_dataplus)._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
             *)pcVar4 == &__return_storage_ptr__->field_2) {
          return __return_storage_ptr__;
        }
        operator_delete(pcVar4);
        return __return_storage_ptr__;
      }
      uVar9 = (ulong)(uVar8 + 1);
    } while (uVar8 + 1 < uVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::u32string LiteScript::String::ConvertToUnicode(const std::string& str) {
    std::u32string res;
    for (unsigned int i = 0, sz = str.size(); i < sz; i++) {
        std::bitset<4> header(((unsigned char)str[i] & (unsigned char)0b11110000) >> 4);
        if (header[3] == 0) {
            //1 byte
            res.push_back((unsigned char)str[i]);
        }
        else if (header[1] == 0) {
            //2 bytes
            if (i >= sz - 1) return res;
            res.push_back(((char32_t) ((unsigned char) str[i] & 0b00011111) << 6) |
                          (char32_t) ((unsigned char) str[i + 1] & 0b00111111));
            i += 1;
        }
        else if (header[0] == 0) {
            //3 bytes
            if (i >= sz - 2) return res;
            res.push_back(((char32_t) ((unsigned char) str[i] & 0b00001111) << 12) |
                          ((char32_t) ((unsigned char) str[i + 1] & 0b00111111) << 6) |
                          (char32_t) ((unsigned char) str[i + 2] & 0b00111111));
            i += 2;
        }
        else {
            //4 bytes
            if (i >= sz - 3) return res;
            res.push_back(((char32_t) ((unsigned char) str[i] & 0b00000111) << 18) |
                          ((char32_t) ((unsigned char) str[i + 1] & 0b00111111) << 12) |
                          ((char32_t) ((unsigned char) str[i + 2] & 0b00111111) << 6) |
                          (char32_t) ((unsigned char) str[i + 3] & 0b00111111));
            i += 3;
        }
    }
    return res;
}